

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::DisallowMarkTempAcrossYield
          (BackwardPass *this,BVSparse<Memory::JitArenaAllocator> *bytecodeUpwardExposed)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  Phase PVar4;
  undefined4 *puVar5;
  
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x18fa,"(!this->IsCollectionPass())","!this->IsCollectionPass()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pBVar1 = this->currentBlock;
  PVar4 = this->tag;
  if (PVar4 == BackwardPhase) {
    bVar3 = SatisfyMarkTempObjectsConditions(this);
    if (bVar3) {
      TempTracker<ObjectTemp>::DisallowMarkTempAcrossYield
                (pBVar1->tempObjectTracker,bytecodeUpwardExposed);
    }
    PVar4 = this->tag;
  }
  if (PVar4 == DeadStorePhase) {
    bVar3 = SatisfyMarkTempObjectsConditions(this);
    if (bVar3) {
      TempTracker<ObjectTempVerify>::DisallowMarkTempAcrossYield
                (pBVar1->tempObjectVerifyTracker,bytecodeUpwardExposed);
      return;
    }
  }
  return;
}

Assistant:

void
BackwardPass::DisallowMarkTempAcrossYield(BVSparse<JitArenaAllocator>* bytecodeUpwardExposed)
{
    Assert(!this->IsCollectionPass());
    BasicBlock* block = this->currentBlock;
    if (this->DoMarkTempNumbers())
    {
        block->tempNumberTracker->DisallowMarkTempAcrossYield(bytecodeUpwardExposed);
    }
    if (this->DoMarkTempObjects())
    {
        block->tempObjectTracker->DisallowMarkTempAcrossYield(bytecodeUpwardExposed);
    }
#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        block->tempObjectVerifyTracker->DisallowMarkTempAcrossYield(bytecodeUpwardExposed);
    }
#endif
}